

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_DoesNotIgnoreKey_Test::
~MessageDifferencerTest_IgnoreField_DoesNotIgnoreKey_Test
          (MessageDifferencerTest_IgnoreField_DoesNotIgnoreKey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_DoesNotIgnoreKey) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  proto2_unittest::TestDiffMessage::Item* item;

  item = msg1.add_item();
  item->set_a(1);
  item->set_b("foo");
  item->add_ra(1);

  item = msg2.add_item();
  item->set_a(2);
  item->set_b("foo");
  item->add_ra(1);

  const FieldDescriptor* item_desc = GetFieldDescriptor(msg1, "item");
  const FieldDescriptor* a = GetFieldDescriptor(msg1, "item.a");

  util::MessageDifferencer differencer;
  differencer.IgnoreField(a);
  differencer.TreatAsMap(item_desc, a);

  EXPECT_FALSE(differencer.Compare(msg1, msg2));
}